

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O2

void sync_write(AV1LfSync *lf_sync,int r,int c,int sb_cols,int plane)

{
  int iVar1;
  
  if (c < sb_cols + -1) {
    if (c % lf_sync->sync_range != 0) {
      return;
    }
  }
  else {
    c = lf_sync->sync_range + sb_cols;
  }
  pthread_mutex_lock((pthread_mutex_t *)(lf_sync->mutex_[plane] + r));
  iVar1 = lf_sync->cur_sb_col[plane][r];
  if (c < iVar1) {
    c = iVar1;
  }
  lf_sync->cur_sb_col[plane][r] = c;
  pthread_cond_broadcast((pthread_cond_t *)(lf_sync->cond_[plane] + r));
  pthread_mutex_unlock((pthread_mutex_t *)(lf_sync->mutex_[plane] + r));
  return;
}

Assistant:

static inline void sync_write(AV1LfSync *const lf_sync, int r, int c,
                              const int sb_cols, int plane) {
#if CONFIG_MULTITHREAD
  const int nsync = lf_sync->sync_range;
  int cur;
  // Only signal when there are enough filtered SB for next row to run.
  int sig = 1;

  if (c < sb_cols - 1) {
    cur = c;
    if (c % nsync) sig = 0;
  } else {
    cur = sb_cols + nsync;
  }

  if (sig) {
    pthread_mutex_lock(&lf_sync->mutex_[plane][r]);

    // When a thread encounters an error, cur_sb_col[plane][r] is set to maximum
    // column number. In this case, the AOMMAX operation here ensures that
    // cur_sb_col[plane][r] is not overwritten with a smaller value thus
    // preventing the infinite waiting of threads in the relevant sync_read()
    // function.
    lf_sync->cur_sb_col[plane][r] = AOMMAX(lf_sync->cur_sb_col[plane][r], cur);

    pthread_cond_broadcast(&lf_sync->cond_[plane][r]);
    pthread_mutex_unlock(&lf_sync->mutex_[plane][r]);
  }
#else
  (void)lf_sync;
  (void)r;
  (void)c;
  (void)sb_cols;
  (void)plane;
#endif  // CONFIG_MULTITHREAD
}